

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

bool __thiscall LiteScript::Class::operator!=(Class *this,Class *c)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)((long)(this->inherit).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inherit).
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  lVar3 = 0;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pOVar2 = Variable::operator->
                       ((Variable *)
                        ((long)&((this->inherit).
                                 super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->obj + lVar3));
    this_00 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(this_00,(Type *)_type_class);
    if (bVar1) {
      pOVar2 = Variable::operator->
                         ((Variable *)
                          ((long)&((this->inherit).
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->obj + lVar3));
      if ((Class *)pOVar2->data == this) break;
    }
    lVar3 = lVar3 + 0x10;
  }
  return uVar5 <= uVar4;
}

Assistant:

bool LiteScript::Class::operator!=(const Class &c) const {
    for (unsigned int i = 0, sz = this->inherit.size(); i < sz; i++) {
        if (this->inherit[i]->GetType() == Type::CLASS && this == &this->inherit[i]->GetData<Class>())
            return false;
    }
    return true;
}